

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::EvaluateInterfaceProperty
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *prop,
          cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagCheckerParent,
          LinkInterfaceFor interfaceFor)

{
  bool evaluateForBuildsystem;
  pointer pcVar1;
  cmLocalGenerator *lg;
  bool bVar2;
  Result RVar3;
  string *__rhs;
  cmGeneratorTarget *headTarget;
  cmValue prop_00;
  cmLinkInterfaceLibraries *pcVar4;
  pointer pcVar5;
  string libResult;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_2d0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorExpressionContext libContext;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = MaybeHaveInterfaceProperty(this,prop,context,interfaceFor);
  if (bVar2) {
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_2d0,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)context);
    std::__cxx11::string::string((string *)&local_250,(string *)prop);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,(cmListFileBacktrace *)&local_2d0,this,&local_250,
               (GeneratorExpressionContent *)0x0,dagCheckerParent);
    std::__cxx11::string::~string((string *)&local_250);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0._M_refcount);
    RVar3 = cmGeneratorExpressionDAGChecker::Check(&dagChecker);
    if (1 < RVar3 - CYCLIC_REFERENCE) {
      if (RVar3 == SELF_REFERENCE) {
        __rhs = GetName_abi_cxx11_(this);
        std::operator+(&local_270,"$<TARGET_PROPERTY:",__rhs);
        std::operator+(&local_2b0,&local_270,",");
        std::operator+(&libResult,&local_2b0,prop);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &libContext,&libResult,">");
        cmGeneratorExpressionDAGChecker::ReportError(&dagChecker,context,(string *)&libContext);
        std::__cxx11::string::~string((string *)&libContext);
        std::__cxx11::string::~string((string *)&libResult);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_270);
      }
      else {
        headTarget = context->HeadTarget;
        if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
          headTarget = this;
        }
        prop_00 = GetProperty(this,prop);
        if (prop_00.Value != (string *)0x0) {
          cmGeneratorExpressionNode::EvaluateDependentExpression
                    ((string *)&libContext,prop_00.Value,context->LG,context,headTarget,&dagChecker,
                     this);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&libContext);
          std::__cxx11::string::~string((string *)&libContext);
        }
        pcVar4 = GetLinkInterfaceLibraries(this,&context->Config,headTarget,interfaceFor);
        if (pcVar4 != (cmLinkInterfaceLibraries *)0x0) {
          bVar2 = true;
          if (context->HadContextSensitiveCondition == false) {
            bVar2 = pcVar4->HadContextSensitiveCondition;
          }
          context->HadContextSensitiveCondition = bVar2;
          pcVar1 = (pcVar4->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pcVar5 = (pcVar4->Libraries).
                        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                        super__Vector_impl_data._M_start; pcVar5 != pcVar1; pcVar5 = pcVar5 + 1) {
            if (pcVar5->Target != this && pcVar5->Target != (cmGeneratorTarget *)0x0) {
              lg = context->LG;
              std::__cxx11::string::string((string *)&local_230,(string *)&context->Config);
              bVar2 = context->Quiet;
              evaluateForBuildsystem = context->EvaluateForBuildsystem;
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_2c0,
                             (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              *)context);
              std::__cxx11::string::string((string *)&local_290,(string *)&context->Language);
              cmGeneratorExpressionContext::cmGeneratorExpressionContext
                        (&libContext,lg,&local_230,bVar2,headTarget,this,evaluateForBuildsystem,
                         (cmListFileBacktrace *)&local_2c0,&local_290);
              std::__cxx11::string::~string((string *)&local_290);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_2c0._M_refcount);
              std::__cxx11::string::~string((string *)&local_230);
              EvaluateInterfaceProperty
                        (&local_2b0,pcVar5->Target,prop,&libContext,&dagChecker,interfaceFor);
              cmGeneratorExpression::StripEmptyListElements(&libResult,&local_2b0);
              std::__cxx11::string::~string((string *)&local_2b0);
              if (libResult._M_string_length != 0) {
                if (__return_storage_ptr__->_M_string_length == 0) {
                  std::__cxx11::string::operator=
                            ((string *)__return_storage_ptr__,(string *)&libResult);
                }
                else {
                  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                }
              }
              bVar2 = libContext.HadContextSensitiveCondition;
              if (context->HadContextSensitiveCondition != false) {
                bVar2 = true;
              }
              context->HadContextSensitiveCondition = bVar2;
              bVar2 = libContext.HadHeadSensitiveCondition;
              if (context->HadHeadSensitiveCondition != false) {
                bVar2 = true;
              }
              context->HadHeadSensitiveCondition = bVar2;
              std::__cxx11::string::~string((string *)&libResult);
              cmGeneratorExpressionContext::~cmGeneratorExpressionContext(&libContext);
            }
          }
        }
      }
    }
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::EvaluateInterfaceProperty(
  std::string const& prop, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagCheckerParent,
  LinkInterfaceFor interfaceFor) const
{
  std::string result;

  // If the property does not appear transitively at all, we are done.
  if (!this->MaybeHaveInterfaceProperty(prop, context, interfaceFor)) {
    return result;
  }

  // Evaluate $<TARGET_PROPERTY:this,prop> as if it were compiled.  This is
  // a subset of TargetPropertyNode::Evaluate without stringify/parse steps
  // but sufficient for transitive interface properties.
  cmGeneratorExpressionDAGChecker dagChecker(context->Backtrace, this, prop,
                                             nullptr, dagCheckerParent);
  switch (dagChecker.Check()) {
    case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
      dagChecker.ReportError(
        context, "$<TARGET_PROPERTY:" + this->GetName() + "," + prop + ">");
      return result;
    case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
      // No error. We just skip cyclic references.
    case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
      // No error. We have already seen this transitive property.
      return result;
    case cmGeneratorExpressionDAGChecker::DAG:
      break;
  }

  cmGeneratorTarget const* headTarget =
    context->HeadTarget ? context->HeadTarget : this;

  if (cmValue p = this->GetProperty(prop)) {
    result = cmGeneratorExpressionNode::EvaluateDependentExpression(
      *p, context->LG, context, headTarget, &dagChecker, this);
  }

  if (cmLinkInterfaceLibraries const* iface = this->GetLinkInterfaceLibraries(
        context->Config, headTarget, interfaceFor)) {
    context->HadContextSensitiveCondition =
      context->HadContextSensitiveCondition ||
      iface->HadContextSensitiveCondition;
    for (cmLinkItem const& lib : iface->Libraries) {
      // Broken code can have a target in its own link interface.
      // Don't follow such link interface entries so as not to create a
      // self-referencing loop.
      if (lib.Target && lib.Target != this) {
        // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in the
        // above property and hand-evaluate it as if it were compiled.
        // Create a context as cmCompiledGeneratorExpression::Evaluate does.
        cmGeneratorExpressionContext libContext(
          context->LG, context->Config, context->Quiet, headTarget, this,
          context->EvaluateForBuildsystem, context->Backtrace,
          context->Language);
        std::string libResult = cmGeneratorExpression::StripEmptyListElements(
          lib.Target->EvaluateInterfaceProperty(prop, &libContext, &dagChecker,
                                                interfaceFor));
        if (!libResult.empty()) {
          if (result.empty()) {
            result = std::move(libResult);
          } else {
            result.reserve(result.size() + 1 + libResult.size());
            result += ";";
            result += libResult;
          }
        }
        context->HadContextSensitiveCondition =
          context->HadContextSensitiveCondition ||
          libContext.HadContextSensitiveCondition;
        context->HadHeadSensitiveCondition =
          context->HadHeadSensitiveCondition ||
          libContext.HadHeadSensitiveCondition;
      }
    }
  }

  return result;
}